

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

int auxgetstr(lua_State *L,TValue *t,char *k)

{
  StkId pTVar1;
  TValue *key;
  int iVar2;
  undefined4 uVar3;
  TString *key_00;
  TValue *slot;
  
  key_00 = luaS_new(L,k);
  if (t->tt_ == 0x45) {
    slot = luaH_getstr((Table *)(t->value_).gc,key_00);
    if (slot->tt_ != 0) {
      pTVar1 = L->top;
      iVar2 = slot->tt_;
      uVar3 = *(undefined4 *)&slot->field_0xc;
      pTVar1->value_ = slot->value_;
      pTVar1->tt_ = iVar2;
      *(undefined4 *)&pTVar1->field_0xc = uVar3;
      L->top = L->top + 1;
      goto LAB_00107ed4;
    }
  }
  else {
    slot = (TValue *)0x0;
  }
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)key_00;
  pTVar1->tt_ = key_00->tt | 0x40;
  key = L->top;
  L->top = key + 1;
  luaV_finishget(L,t,key,key,slot);
LAB_00107ed4:
  return L->top[-1].tt_ & 0xf;
}

Assistant:

static int auxgetstr(lua_State *L, const TValue *t, const char *k) {
    const TValue *slot;
    TString *str = luaS_new(L, k);
    if (luaV_fastget(L, t, str, slot, luaH_getstr)) {
        setobj2s(L, L->top, slot);
        api_incr_top(L);
    } else {
        setsvalue2s(L, L->top, str);
        api_incr_top(L);
        luaV_finishget(L, t, L->top - 1, L->top - 1, slot);
    }
    lua_unlock(L);
    return ttnov(L->top - 1);
}